

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_matcher.hpp
# Opt level: O2

void __thiscall
duckdb::SpecificFunctionMatcher::~SpecificFunctionMatcher(SpecificFunctionMatcher *this)

{
  ~SpecificFunctionMatcher(this);
  operator_delete(this);
  return;
}

Assistant:

explicit SpecificFunctionMatcher(string name_p) : name(std::move(name_p)) {
	}